

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O2

bool duckdb::Equals::Operation<float>(float *left,float *right)

{
  bool bVar1;
  
  bVar1 = EqualsFloat<float>(*left,*right);
  return bVar1;
}

Assistant:

bool Equals::Operation(const float &left, const float &right) {
	return EqualsFloat<float>(left, right);
}